

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O3

void __thiscall
CapturedValues::CopyTo(CapturedValues *this,JitArenaAllocator *allocator,CapturedValues *other)

{
  Type pJVar1;
  Type pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  Type_conflict pBVar7;
  Type_conflict pBVar8;
  
  if (other == (CapturedValues *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x3b,"(other != nullptr)","other != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>::
  CopyTo<&SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>::DefaultCopyElement>
            ((SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
              *)this,&allocator->super_ArenaAllocator,&other->constantValues);
  SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
  CopyTo<&SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::DefaultCopyElement>
            ((SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>
              *)&this->copyPropSyms,&allocator->super_ArenaAllocator,&other->copyPropSyms);
  pBVar6 = other->argObjSyms;
  if (pBVar6 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (pBVar6->head != (Type_conflict)0x0) {
      pJVar1 = pBVar6->alloc;
      pBVar2 = pBVar6->head;
      pBVar8 = pJVar1->bvFreeList;
      do {
        pBVar7 = pBVar2;
        pBVar2 = pBVar7->next;
        pBVar7->next = pBVar8;
        pBVar8 = pBVar7;
      } while (pBVar2 != (Type)0x0);
      pJVar1->bvFreeList = pBVar7;
    }
    pBVar6->head = (Type_conflict)0x0;
    pBVar6->lastFoundIndex = (Type_conflict)0x0;
    pBVar6->lastUsedNodePrevNextField = &pBVar6->head;
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,other->argObjSyms);
  }
  if (this->argObjSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    pBVar6 = BVSparse<Memory::JitArenaAllocator>::CopyNew(this->argObjSyms,allocator);
  }
  other->argObjSyms = pBVar6;
  return;
}

Assistant:

void CopyTo(JitArenaAllocator *allocator, CapturedValues *other) const
    {
        Assert(other != nullptr);
        this->constantValues.CopyTo(allocator, other->constantValues);
        this->copyPropSyms.CopyTo(allocator, other->copyPropSyms);

        if (other->argObjSyms != nullptr)
        {
            other->argObjSyms->ClearAll();
            JitAdelete(allocator, other->argObjSyms);
        }

        if (this->argObjSyms != nullptr)
        {
            other->argObjSyms = this->argObjSyms->CopyNew(allocator);
        }
        else
        {
            other->argObjSyms = nullptr;
        }

        // Ignore refCount because other objects might still reference it
    }